

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

SumVec * __thiscall Clasp::SharedMinimizeData::setOptimum(SharedMinimizeData *this,wsum_t *newOpt)

{
  uint uVar1;
  uint n;
  uint uVar2;
  __int_type _Var3;
  __int_type _Var4;
  pod_vector<long,std::allocator<long>> *this_00;
  Memcpy<long> local_20;
  
  if (this->optGen_ == 0) {
    uVar1 = (this->gCount_).super___atomic_base<unsigned_int>._M_i;
    uVar2 = (~uVar1 & 1) << 4;
    this_00 = (pod_vector<long,std::allocator<long>> *)((long)&this->up_[0].ebo_.buf + (ulong)uVar2)
    ;
    n = (this->adjust_).ebo_.size;
    *(undefined4 *)((long)&this->up_[0].ebo_.size + (ulong)uVar2) = 0;
    local_20.first_ = newOpt;
    bk_lib::pod_vector<long,std::allocator<long>>::
    insert_impl<unsigned_int,bk_lib::detail::Memcpy<long>>(this_00,*(iterator *)this_00,n,&local_20)
    ;
    if (this->mode_ != enumerate) {
      _Var4 = uVar1 + 1;
      _Var3 = 2;
      if (_Var4 != 0) {
        _Var3 = _Var4;
      }
      LOCK();
      (this->gCount_).super___atomic_base<unsigned_int>._M_i = _Var3;
      UNLOCK();
    }
  }
  else {
    this_00 = (pod_vector<long,std::allocator<long>> *)
              ((long)&this->up_[0].ebo_.buf + (ulong)((this->optGen_ & 1) << 4));
  }
  return (SumVec *)this_00;
}

Assistant:

const SumVec* SharedMinimizeData::setOptimum(const wsum_t* newOpt) {
	if (optGen_) { return up_ + (optGen_&1u); }
	uint32  g = gCount_;
	uint32  n = 1u - (g & 1u);
	SumVec& U = up_[n];
	U.assign(newOpt, newOpt + numRules());
	assert(mode() != MinimizeMode_t::enumerate || n == 1);
	if (mode() != MinimizeMode_t::enumerate) {
		if (++g == 0) { g = 2; }
		gCount_  = g;
	}
	return &U;
}